

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_pxr24.c
# Opt level: O0

exr_result_t apply_pxr24_impl(exr_encode_pipeline_t *encode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint16_t uVar4;
  float f;
  uint32_t uVar5;
  int iVar6;
  exr_result_t eVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  long in_RDI;
  uint32_t diff_2;
  uint32_t pixel24;
  anon_union_4_2_947300a4 v;
  int x_2;
  float *din_2;
  uint32_t prevPixel_2;
  uint8_t *ptr_2 [3];
  uint32_t diff_1;
  uint32_t pixel_1;
  int x_1;
  uint16_t *din_1;
  uint32_t prevPixel_1;
  uint8_t *ptr_1 [2];
  uint32_t diff;
  uint32_t pixel;
  int x;
  uint32_t *din;
  uint32_t prevPixel;
  uint8_t *ptr [4];
  uint64_t nBytes;
  int w;
  exr_coding_channel_info_t *curc;
  int c;
  int cury;
  int y;
  exr_result_t rv;
  size_t compbufsz;
  uint8_t *lastIn;
  uint64_t nOut;
  uint8_t *out;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar11;
  int local_fc;
  undefined4 in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  undefined1 *in_stack_ffffffffffffff18;
  undefined1 *in_stack_ffffffffffffff20;
  undefined1 *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int local_bc;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int local_8c;
  uint32_t local_7c;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  int local_40;
  int local_38;
  ulong local_30;
  long local_20;
  undefined1 *local_18;
  
  local_18 = *(undefined1 **)(in_RDI + 0xc0);
  local_20 = 0;
  local_38 = 0;
  do {
    if (*(int *)(in_RDI + 0x2c) <= local_38) {
      eVar7 = exr_compress_buffer((exr_const_context_t)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                                  (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  (size_t *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (eVar7 == 0) {
        if (*(ulong *)(in_RDI + 0x70) < local_30) {
          memcpy(*(void **)(in_RDI + 0xa8),*(void **)(in_RDI + 0x68),*(size_t *)(in_RDI + 0x70));
          local_30 = *(ulong *)(in_RDI + 0x70);
        }
        *(ulong *)(in_RDI + 0xb0) = local_30;
      }
      return eVar7;
    }
    iVar2 = *(int *)(in_RDI + 0x28);
    for (local_40 = 0; local_40 < *(short *)(in_RDI + 0x10); local_40 = local_40 + 1) {
      lVar8 = *(long *)(in_RDI + 8) + (long)local_40 * 0x30;
      iVar3 = *(int *)(lVar8 + 0xc);
      lVar9 = (long)iVar3;
      if ((*(int *)(lVar8 + 8) != 0) &&
         ((*(int *)(lVar8 + 0x14) < 2 || ((local_38 + iVar2) % *(int *)(lVar8 + 0x14) == 0)))) {
        sVar1 = *(short *)(lVar8 + 0x1a);
        if (sVar1 == 0) {
          local_7c = 0;
          if (*(ulong *)(in_RDI + 200) < (ulong)(local_20 + lVar9 * 4)) {
            return 1;
          }
          local_20 = lVar9 * 4 + local_20;
          local_78 = local_18;
          local_70 = local_18 + iVar3;
          puVar10 = local_70 + iVar3;
          uVar11 = 0;
          local_68 = puVar10;
          local_60 = puVar10 + iVar3;
          for (local_8c = 0; local_18 = puVar10 + iVar3 + iVar3, local_8c < iVar3;
              local_8c = local_8c + 1) {
            uVar5 = unaligned_load32((void *)CONCAT44(uVar11,in_stack_fffffffffffffef0));
            iVar6 = uVar5 - local_7c;
            *local_78 = (char)((uint)iVar6 >> 0x18);
            *local_70 = (char)((uint)iVar6 >> 0x10);
            *local_68 = (char)((uint)iVar6 >> 8);
            *local_60 = (char)iVar6;
            local_7c = uVar5;
            local_78 = local_78 + 1;
            local_70 = local_70 + 1;
            local_68 = local_68 + 1;
            local_60 = local_60 + 1;
          }
        }
        else if (sVar1 == 1) {
          if (*(ulong *)(in_RDI + 200) < (ulong)(local_20 + lVar9 * 2)) {
            return 1;
          }
          local_20 = lVar9 * 2 + local_20;
          local_a8 = local_18;
          puVar10 = local_18 + iVar3;
          uVar11 = 1;
          in_stack_ffffffffffffff54 = 0;
          local_a0 = puVar10;
          for (local_bc = 0; local_18 = puVar10 + iVar3, local_bc < iVar3; local_bc = local_bc + 1)
          {
            uVar4 = unaligned_load16((void *)CONCAT44(uVar11,in_stack_fffffffffffffef0));
            in_stack_ffffffffffffff3c = uVar4 - in_stack_ffffffffffffff54;
            *local_a8 = (char)((uint)in_stack_ffffffffffffff3c >> 8);
            *local_a0 = (char)in_stack_ffffffffffffff3c;
            in_stack_ffffffffffffff54 = (uint)uVar4;
            local_a8 = local_a8 + 1;
            local_a0 = local_a0 + 1;
          }
        }
        else {
          if (sVar1 != 2) {
            return 3;
          }
          if (*(ulong *)(in_RDI + 200) < (ulong)(local_20 + lVar9 * 3)) {
            return 1;
          }
          local_20 = lVar9 * 3 + local_20;
          puVar10 = local_18 + iVar3;
          uVar11 = 2;
          in_stack_ffffffffffffff14 = 0;
          in_stack_ffffffffffffff18 = local_18;
          in_stack_ffffffffffffff20 = puVar10;
          in_stack_ffffffffffffff28 = puVar10 + iVar3;
          for (local_fc = 0; local_18 = puVar10 + iVar3 + iVar3, local_fc < iVar3;
              local_fc = local_fc + 1) {
            f = (float)unaligned_load32((void *)CONCAT44(uVar11,in_stack_fffffffffffffef0));
            uVar5 = float_to_float24(f);
            iVar6 = uVar5 - in_stack_ffffffffffffff14;
            *in_stack_ffffffffffffff18 = (char)((uint)iVar6 >> 0x10);
            *in_stack_ffffffffffffff20 = (char)((uint)iVar6 >> 8);
            *in_stack_ffffffffffffff28 = (char)iVar6;
            in_stack_ffffffffffffff14 = uVar5;
            in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 + 1;
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1;
            in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 + 1;
          }
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static exr_result_t
apply_pxr24_impl (exr_encode_pipeline_t* encode)
{
    uint8_t*       out    = encode->scratch_buffer_1;
    uint64_t       nOut   = 0;
    const uint8_t* lastIn = encode->packed_buffer;
    size_t         compbufsz;
    exr_result_t   rv;

    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc   = encode->channels + c;
            int                              w      = curc->width;
            uint64_t                         nBytes = (uint64_t) (w);

            if (curc->height == 0 ||
                (curc->y_samples > 1 && (cury % curc->y_samples) != 0))
                continue;

            switch (curc->data_type)
            {
                case EXR_PIXEL_UINT: {
                    uint8_t*        ptr[4];
                    uint32_t        prevPixel = 0;
                    const uint32_t* din       = (const uint32_t*) (lastIn);

                    nBytes *= sizeof (uint32_t);
                    if (nOut + nBytes > encode->scratch_alloc_size_1)
                        return EXR_ERR_OUT_OF_MEMORY;
                    nOut += nBytes;
                    lastIn += nBytes;

                    ptr[0] = out;
                    out += w;
                    ptr[1] = out;
                    out += w;
                    ptr[2] = out;
                    out += w;
                    ptr[3] = out;
                    out += w;

                    for (int x = 0; x < w; ++x)
                    {
                        uint32_t pixel = unaligned_load32 (din);
                        uint32_t diff  = pixel - prevPixel;
                        prevPixel      = pixel;

                        ++din;
                        *(ptr[0]++) = (uint8_t) (diff >> 24);
                        *(ptr[1]++) = (uint8_t) (diff >> 16);
                        *(ptr[2]++) = (uint8_t) (diff >> 8);
                        *(ptr[3]++) = (uint8_t) (diff);
                    }
                    break;
                }
                case EXR_PIXEL_HALF: {
                    uint8_t*        ptr[2];
                    uint32_t        prevPixel = 0;
                    const uint16_t* din       = (const uint16_t*) (lastIn);

                    nBytes *= sizeof (uint16_t);
                    if (nOut + nBytes > encode->scratch_alloc_size_1)
                        return EXR_ERR_OUT_OF_MEMORY;
                    nOut += nBytes;
                    lastIn += nBytes;

                    ptr[0] = out;
                    out += w;
                    ptr[1] = out;
                    out += w;

                    for (int x = 0; x < w; ++x)
                    {
                        uint32_t pixel = (uint32_t) unaligned_load16 (din);
                        uint32_t diff  = pixel - prevPixel;
                        prevPixel      = pixel;

                        ++din;
                        *(ptr[0]++) = (uint8_t) (diff >> 8);
                        *(ptr[1]++) = (uint8_t) (diff);
                    }
                    break;
                }
                case EXR_PIXEL_FLOAT: {
                    uint8_t*     ptr[3];
                    uint32_t     prevPixel = 0;
                    const float* din       = (const float*) (lastIn);

                    nBytes *= 3;
                    if (nOut + nBytes > encode->scratch_alloc_size_1)
                        return EXR_ERR_OUT_OF_MEMORY;
                    nOut += nBytes;
                    lastIn += w * 4;

                    ptr[0] = out;
                    out += w;
                    ptr[1] = out;
                    out += w;
                    ptr[2] = out;
                    out += w;

                    for (int x = 0; x < w; ++x)
                    {
                        union
                        {
                            uint32_t i;
                            float    f;
                        } v;
                        uint32_t pixel24, diff;
                        v.i       = unaligned_load32 (din);
                        pixel24   = float_to_float24 (v.f);
                        diff      = pixel24 - prevPixel;
                        prevPixel = pixel24;

                        ++din;
                        *(ptr[0]++) = (uint8_t) (diff >> 16);
                        *(ptr[1]++) = (uint8_t) (diff >> 8);
                        *(ptr[2]++) = (uint8_t) (diff);
                    }
                    break;
                }
                default: return EXR_ERR_INVALID_ARGUMENT;
            }
        }
    }

    rv = exr_compress_buffer (
        encode->context,
        -1,
        encode->scratch_buffer_1,
        nOut,
        encode->compressed_buffer,
        encode->compressed_alloc_size,
        &compbufsz);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (compbufsz > encode->packed_bytes)
        {
            memcpy (
                encode->compressed_buffer,
                encode->packed_buffer,
                encode->packed_bytes);
            compbufsz = encode->packed_bytes;
        }
        encode->compressed_bytes = compbufsz;
    }
    return rv;
}